

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall embree::OBJMaterial::OBJMaterial(OBJMaterial *this,string *name)

{
  MaterialNode *in_RDI;
  string *in_stack_ffffffffffffff18;
  
  SceneGraph::MaterialNode::MaterialNode(in_RDI,in_stack_ffffffffffffff18);
  (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__OBJMaterial_00600590;
  Material::Material((Material *)&in_RDI[1].super_Node.super_RefCount.refCounter,MATERIAL_OBJ);
  *(undefined4 *)&in_RDI[1].super_Node.fileName._M_string_length = 0;
  *(undefined4 *)((long)&in_RDI[1].super_Node.fileName._M_string_length + 4) = 0x3f800000;
  *(undefined4 *)&in_RDI[1].super_Node.fileName.field_2 = 0x3f800000;
  *(undefined4 *)((long)&in_RDI[1].super_Node.fileName.field_2 + 4) = 0x3f800000;
  *(undefined8 *)((long)&in_RDI[1].super_Node.fileName.field_2 + 8) = 0;
  *(undefined8 *)&in_RDI[1].super_Node.name = 0;
  in_RDI[1].super_Node.name._M_string_length = 0x3f8000003f800000;
  in_RDI[1].super_Node.name.field_2._M_allocated_capacity = 0x3f8000003f800000;
  *(undefined8 *)((long)&in_RDI[1].super_Node.name.field_2 + 8) = 0;
  in_RDI[1].super_Node.indegree = 0;
  in_RDI[1].super_Node.closed = false;
  in_RDI[1].super_Node.hasLightOrCamera = false;
  *(undefined2 *)&in_RDI[1].super_Node.field_0x5a = 0x3f80;
  in_RDI[1].super_Node.id = 0x3f800000;
  in_RDI[1].super_Node.geometry = (void *)0x3f8000003f800000;
  in_RDI[2].super_Node.super_RefCount._vptr_RefCount = (_func_int **)0x0;
  in_RDI[2].super_Node.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&in_RDI[2].super_Node.fileName = 0;
  in_RDI[2].super_Node.fileName._M_string_length = 0;
  in_RDI[2].super_Node.fileName.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[2].super_Node.fileName.field_2 + 8) = 0;
  *(undefined8 *)&in_RDI[2].super_Node.name = 0;
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x17ce38);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x17ce49);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x17ce5a);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x17ce6b);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x17ce7c);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x17ce8d);
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x17ce9e);
  return;
}

Assistant:

OBJMaterial (const std::string name = "")
      : SceneGraph::MaterialNode(name), base(MATERIAL_OBJ), illum(0), d(1.f), Ns(1.f), Ni(1.f), Ka(0.f), Kd(1.f), Ks(0.f), Kt(1.0f),
        map_d(nullptr), map_Ka(nullptr), map_Kd(nullptr), map_Ks(nullptr), map_Kt(nullptr), map_Ns(nullptr), map_Displ(nullptr) {}